

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamWriter::writeCDATA(QXmlStreamWriter *this,QAnyStringView text)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  ulong uVar1;
  size_t in_RCX;
  void *__buf;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  ulong uVar3;
  QLatin1StringView haystack;
  QLatin1StringView needle;
  
  __buf = (void *)text.m_size;
  aVar2 = text.field_0;
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  QXmlStreamWriterPrivate::finishStartElement(this_00._M_head_impl,true);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x57d1aa,(void *)0x9,in_RCX);
  uVar3 = (ulong)__buf & 0x3fffffffffffffff;
  if (((undefined1  [16])text & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) {
    do {
      haystack.m_data = aVar2.m_data_utf8;
      haystack.m_size = uVar3;
      needle.m_data = "]]>";
      needle.m_size = 3;
      in_RCX = 3;
      uVar1 = QtPrivate::findString(haystack,0,needle,CaseSensitive);
      if ((long)uVar1 < 0) break;
      QXmlStreamWriterPrivate::write
                (this_00._M_head_impl,aVar2._0_4_,
                 (void *)(uVar1 | (ulong)__buf & 0xc000000000000000),in_RCX);
      QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x57d1b4,(void *)0xf,in_RCX);
      in_RCX = in_RCX & 0xffffffffffffff00;
      uVar3 = uVar3 - (uVar1 + 3);
      aVar2.m_data = aVar2.m_data + uVar1 + 3;
      __buf = (void *)((ulong)__buf & 0xc000000000000000 | uVar3);
      uVar3 = uVar3 & 0x3fffffffffffffff;
    } while (uVar3 != 0);
  }
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,aVar2._0_4_,__buf,in_RCX);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x57cbe7,(void *)0x3,in_RCX);
  return;
}

Assistant:

void QXmlStreamWriter::writeCDATA(QAnyStringView text)
{
    Q_D(QXmlStreamWriter);
    d->finishStartElement();
    d->write("<![CDATA[");
    while (!text.isEmpty()) {
        const auto idx = indexOf(text, "]]>"_L1);
        if (idx < 0)
            break;                   // no forbidden sequence found
        d->write(text.first(idx));
        d->write("]]"                // text[idx, idx + 2)
                 "]]><![CDATA["      // escape sequence to separate ]] and >
                 ">");               // text[idx + 2, idx + 3)
        text = text.sliced(idx + 3); // skip over "]]>"
    }
    d->write(text); // write remainder
    d->write("]]>");
}